

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jglp.cpp
# Opt level: O2

void __thiscall
merlin::jglp::partition
          (jglp *this,variable VX,vector<merlin::factor,_std::allocator<merlin::factor>_> *fin,
          vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          *vin,vector<double,_std::allocator<double>_> *Norm,
          vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          *Orig,vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                *New,flist *ids)

{
  _Rb_tree_header *p_Var1;
  _func_int **pp_Var2;
  _func_int **i;
  pointer pfVar3;
  pointer pdVar4;
  pointer pmVar5;
  pointer puVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  long lVar9;
  vector<merlin::factor,_std::allocator<merlin::factor>_> *pvVar10;
  double *pdVar11;
  double *pdVar12;
  double dVar13;
  multimap<double,_merlin::jglp::sPair,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
  scores;
  map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
  reverseScore;
  _func_int **local_140;
  vector<merlin::factor,_std::allocator<merlin::factor>_> *local_138;
  key_type local_130;
  _func_int **local_120;
  jglp *local_118;
  vector<double,_std::allocator<double>_> *local_110;
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> *local_108;
  variable local_100;
  factor local_f0;
  _Rb_tree<double,_std::pair<const_double,_merlin::jglp::sPair>,_std::_Select1st<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
  local_90;
  _Rb_tree<merlin::jglp::sPair,_std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>,_std::_Select1st<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
  local_60;
  
  local_100.m_states = VX.m_states;
  local_100.m_label = VX.m_label;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138 = fin;
  local_118 = this;
  local_110 = Norm;
  local_108 = vin;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pdVar12 = (double *)
                 (ids->super_my_vector<unsigned_long>).
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pdVar12 !=
      (double *)
      (ids->super_my_vector<unsigned_long>).
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish; pdVar12 = pdVar12 + 1) {
    for (pdVar11 = (double *)
                   (ids->super_my_vector<unsigned_long>).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; pdVar11 != pdVar12; pdVar11 = pdVar11 + 1) {
      local_f0._vptr_factor =
           (_func_int **)score(local_118,local_138,&local_100,(size_t)*pdVar12,(size_t)*pdVar11);
      pp_Var2 = (_func_int **)*pdVar12;
      local_130.super_pair<unsigned_long,_unsigned_long>.second = (unsigned_long)*pdVar11;
      local_130.super_pair<unsigned_long,_unsigned_long>.first =
           local_130.super_pair<unsigned_long,_unsigned_long>.second;
      if (pp_Var2 >= local_130.super_pair<unsigned_long,_unsigned_long>.second &&
          pp_Var2 != (_func_int **)local_130.super_pair<unsigned_long,_unsigned_long>.second) {
        local_130.super_pair<unsigned_long,_unsigned_long>.first = (unsigned_long)pp_Var2;
      }
      if (pp_Var2 < local_130.super_pair<unsigned_long,_unsigned_long>.second) {
        local_130.super_pair<unsigned_long,_unsigned_long>.second = (unsigned_long)pp_Var2;
      }
      local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_130.super_pair<unsigned_long,_unsigned_long>.first;
      local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_130.super_pair<unsigned_long,_unsigned_long>.second;
      iVar7 = std::
              _Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
              ::_M_emplace_equal<std::pair<double,merlin::jglp::sPair>>
                        ((_Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                          *)&local_90,(pair<double,_merlin::jglp::sPair> *)&local_f0);
      pmVar8 = std::
               map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
               ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                             *)&local_60,&local_130);
      pmVar8->_M_node = iVar7._M_node;
    }
    local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*pdVar12;
    local_f0._vptr_factor = (_func_int **)0xbff0000000000000;
    local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    iVar7 = std::
            _Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
            ::_M_emplace_equal<std::pair<double,merlin::jglp::sPair>>
                      ((_Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                        *)&local_90,(pair<double,_merlin::jglp::sPair> *)&local_f0);
    local_130.super_pair<unsigned_long,_unsigned_long>.first = (unsigned_long)*pdVar12;
    local_130.super_pair<unsigned_long,_unsigned_long>.second =
         local_130.super_pair<unsigned_long,_unsigned_long>.first;
    pmVar8 = std::
             map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
             ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                           *)&local_60,&local_130);
    pmVar8->_M_node = iVar7._M_node;
  }
  pvVar10 = local_138;
  while( true ) {
    p_Var1 = &local_90._M_impl.super__Rb_tree_header;
    lVar9 = std::_Rb_tree_decrement(&p_Var1->_M_header);
    if (*(double *)(lVar9 + 0x20) <= 0.0 && *(double *)(lVar9 + 0x20) != 0.0) break;
    lVar9 = std::_Rb_tree_decrement(&p_Var1->_M_header);
    pp_Var2 = *(_func_int ***)(lVar9 + 0x28);
    local_140 = pp_Var2;
    lVar9 = std::_Rb_tree_decrement(&p_Var1->_M_header);
    i = *(_func_int ***)(lVar9 + 0x30);
    pfVar3 = (pvVar10->super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>)._M_impl.
             super__Vector_impl_data._M_start;
    factor::binaryOpIP<merlin::factor::binOpTimes>(pfVar3 + (long)i,pfVar3 + (long)pp_Var2);
    pdVar4 = (local_110->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[(long)i] = pdVar4[(long)local_140] + pdVar4[(long)i];
    local_120 = (_func_int **)
                factor::max((pvVar10->
                            super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>).
                            _M_impl.super__Vector_impl_data._M_start + (long)i);
    pvVar10 = local_138;
    factor::binaryOpIP<merlin::factor::binOpDivide>
              ((local_138->super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>).
               _M_impl.super__Vector_impl_data._M_start + (long)i);
    dVar13 = ::log((double)local_120);
    local_118->m_logz = local_118->m_logz + dVar13;
    pdVar4 = (local_110->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[(long)i] = dVar13 + pdVar4[(long)i];
    graphical_model::erase
              (&local_118->super_graphical_model,local_108,(findex)local_140,
               &(pvVar10->super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>).
                _M_impl.super__Vector_impl_data._M_start[(long)local_140].v_);
    factor::factor(&local_f0,1.0);
    factor::operator=((local_138->
                      super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>)._M_impl.
                      super__Vector_impl_data._M_start + (long)local_140,&local_f0);
    factor::~factor(&local_f0);
    pmVar5 = (Orig->
             super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    my_set<unsigned_long>::operator|=(pmVar5 + (long)i,pmVar5 + (long)local_140);
    pmVar5 = (Orig->
             super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar6 = *(pointer *)
              &pmVar5[(long)local_140].super_my_vector<unsigned_long>.
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    if (*(pointer *)
         ((long)&pmVar5[(long)local_140].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) != puVar6) {
      *(pointer *)
       ((long)&pmVar5[(long)local_140].super_my_vector<unsigned_long>.
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) = puVar6;
    }
    pmVar5 = (New->
             super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    my_set<unsigned_long>::operator|=(pmVar5 + (long)i,pmVar5 + (long)local_140);
    pmVar5 = (New->
             super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar6 = *(pointer *)
              &pmVar5[(long)local_140].super_my_vector<unsigned_long>.
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    if (*(pointer *)
         ((long)&pmVar5[(long)local_140].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) != puVar6) {
      *(pointer *)
       ((long)&pmVar5[(long)local_140].super_my_vector<unsigned_long>.
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) = puVar6;
    }
    for (pdVar12 = (double *)
                   (ids->super_my_vector<unsigned_long>).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pdVar12 !=
        (double *)
        (ids->super_my_vector<unsigned_long>).
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish; pdVar12 = pdVar12 + 1) {
      local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*pdVar12;
      local_f0._vptr_factor =
           (_func_int **)
           local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
      if (local_140 >=
          local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start &&
          local_140 !=
          (_func_int **)
          local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_f0._vptr_factor = local_140;
      }
      if (local_140 <
          local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_140;
      }
      pmVar8 = std::
               map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
               ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                             *)&local_60,(key_type *)&local_f0);
      std::
      _Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                          *)&local_90,pmVar8->_M_node);
    }
    my_set<unsigned_long>::operator/=(ids,(unsigned_long *)&local_140);
    pvVar10 = local_138;
    for (pdVar12 = (double *)
                   (ids->super_my_vector<unsigned_long>).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pdVar12 !=
        (double *)
        (ids->super_my_vector<unsigned_long>).
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish; pdVar12 = pdVar12 + 1) {
      if ((_func_int **)*pdVar12 != i) {
        local_120 = (_func_int **)score(local_118,pvVar10,&local_100,(size_t)i,(size_t)*pdVar12);
        local_130.super_pair<unsigned_long,_unsigned_long>.second = (unsigned_long)*pdVar12;
        local_130.super_pair<unsigned_long,_unsigned_long>.first =
             local_130.super_pair<unsigned_long,_unsigned_long>.second;
        if (i >= local_130.super_pair<unsigned_long,_unsigned_long>.second &&
            i != (_func_int **)local_130.super_pair<unsigned_long,_unsigned_long>.second) {
          local_130.super_pair<unsigned_long,_unsigned_long>.first = (unsigned_long)i;
        }
        if (i < local_130.super_pair<unsigned_long,_unsigned_long>.second) {
          local_130.super_pair<unsigned_long,_unsigned_long>.second = (unsigned_long)i;
        }
        pmVar8 = std::
                 map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                 ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                               *)&local_60,&local_130);
        std::
        _Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
        ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                            *)&local_90,pmVar8->_M_node);
        local_f0._vptr_factor = local_120;
        local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)local_130.super_pair<unsigned_long,_unsigned_long>.first;
        local_f0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)local_130.super_pair<unsigned_long,_unsigned_long>.second;
        iVar7 = std::
                _Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                ::_M_emplace_equal<std::pair<double,merlin::jglp::sPair>>
                          ((_Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                            *)&local_90,(pair<double,_merlin::jglp::sPair> *)&local_f0);
        pmVar8 = std::
                 map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                 ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                               *)&local_60,&local_130);
        pmVar8->_M_node = iVar7._M_node;
      }
    }
  }
  std::
  _Rb_tree<merlin::jglp::sPair,_std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>,_std::_Select1st<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<double,_std::pair<const_double,_merlin::jglp::sPair>,_std::_Select1st<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

void jglp::partition(variable VX, std::vector<factor>& fin, std::vector<flist>& vin,
		std::vector<double>& Norm, std::vector<flist>& Orig,
		std::vector<flist>& New, flist& ids) {

	// Select allocation into buckets
	typedef std::pair<double, sPair> _INS;
	std::multimap<double, sPair> scores;
	std::map<sPair, std::multimap<double, sPair>::iterator> reverseScore;

	// Populate list of pairwise scores for aggregation
	for (flistIt i = ids.begin(); i != ids.end(); ++i) {
		for (flistIt j = ids.begin(); j != i; ++j) {
			double err = score(fin, VX, *i, *j);
			sPair sp(*i, *j);
			reverseScore[sp] = scores.insert(_INS(err, sp)); // save score
		}
		reverseScore[sPair(*i, *i)] = scores.insert(
				_INS(-1, sPair(*i, *i)));    // mark self index at -1
	}

	// Run through until no more pairs can be aggregated:
	//   Find the best pair (ii,jj) according to the scoring heuristic
	//   and join them as jj; then remove ii and re-score all pairs with jj
	for (;;) {
		std::multimap<double, sPair>::reverse_iterator top = scores.rbegin();
		if (top->first < 0)
			break;                         // if can't do any more, quit
		else {
			size_t ii = top->second.first, jj = top->second.second;
//				std::cout<<"Joining "<<ii<<","<<jj<<"; size "<<(fin[ii].vars()+fin[jj].vars()).nrStates()<<"\n";
			fin[jj] *= fin[ii];                        // combine into j
			Norm[jj] += Norm[ii];
			double mx = fin[jj].max();
			fin[jj] /= mx;
			mx = std::log(mx);
			m_logz += mx;
			Norm[jj] += mx;
			erase(vin, ii, fin[ii].vars());
			fin[ii] = factor();  //   & remove i

			Orig[jj] |= Orig[ii];
			Orig[ii].clear(); // keep track of list of original factors in this cluster
			New[jj] |= New[ii];
			New[ii].clear(); //   list of new "message" clusters incoming to this cluster

			for (flistIt k = ids.begin(); k != ids.end(); ++k) { // removing entry i => remove (i,k) for all k
				scores.erase(reverseScore[sPair(ii, *k)]);
			}

			ids /= ii;

			for (flistIt k = ids.begin(); k != ids.end(); ++k) { // updated j; rescore all pairs (j,k)
				if (*k == jj)
					continue;
				double err = score(fin, VX, jj, *k);
				sPair sp(jj, *k);
				scores.erase(reverseScore[sp]);    // change score (i,j)
				reverseScore[sp] = scores.insert(_INS(err, sp));  //
			}
		}
	}
}